

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

ParseArgumentStatus __thiscall
google::protobuf::compiler::CommandLineInterface::InterpretArgument
          (CommandLineInterface *this,string *name,string *value)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  char *pcVar6;
  LogMessage *pLVar7;
  const_pointer __name;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar8;
  ostream *poVar9;
  Mode MVar10;
  AlphaNum *in_RCX;
  int version;
  char *in_R9;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  string_view name_00;
  string_view name_01;
  string_view plugin_prefix;
  string_view directive_00;
  string local_608 [32];
  string local_5e8 [32];
  long local_5c8;
  size_type colon_pos;
  OutputDirective directive;
  string local_538;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>
  local_518;
  string *parameters_1;
  string_view local_500;
  string_view local_4f0;
  string_view local_4e0;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>
  local_4d0;
  string *parameters;
  string_view local_4b8;
  GeneratorInfo *local_4a8;
  GeneratorInfo *generator_info;
  AlphaNum local_470;
  string local_440;
  undefined1 local_420 [16];
  AlphaNum local_410;
  AlphaNum local_3e0;
  string local_3b0;
  undefined1 local_390 [16];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  long local_320;
  size_type slash_pos;
  size_type equals_pos_1;
  string path;
  string plugin_name;
  string_view local_2a8;
  ByAnyChar local_298;
  ConvertibleToStringView local_278;
  Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_210;
  byte local_201;
  LogMessage local_200;
  Voidify local_1ea [2];
  ConvertibleToStringView local_1e8;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_1d8;
  undefined1 local_1c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  direct;
  string local_160 [32];
  string local_140 [32];
  long local_120;
  size_type equals_pos;
  string disk_path;
  string virtual_path;
  size_t i;
  string_view local_b8;
  ByAnyChar local_a8;
  ConvertibleToStringView local_88;
  Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_78;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string *value_local;
  string *name_local;
  CommandLineInterface *this_local;
  
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = value;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->input_files_,
                  parts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    poVar9 = std::operator<<((ostream *)&std::cerr,
                             "You seem to have passed an empty string as one of the arguments to ");
    poVar9 = std::operator<<(poVar9,(string *)this);
    poVar9 = std::operator<<(poVar9,
                             ".  This is actually sort of hard to do.  Congrats.  Unfortunately it is not valid input so the program is going to die now."
                            );
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    return PARSE_ARGUMENT_FAIL;
  }
  bVar1 = std::operator==(name,"-I");
  if ((bVar1) || (bVar1 = std::operator==(name,"--proto_path"), bVar1)) {
    absl::lts_20250127::strings_internal::ConvertibleToStringView::ConvertibleToStringView
              (&local_88,
               parts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,":");
    absl::lts_20250127::ByAnyChar::ByAnyChar(&local_a8,local_b8);
    absl::lts_20250127::StrSplit<absl::lts_20250127::ByAnyChar,absl::lts_20250127::SkipEmpty>
              (&local_78,(lts_20250127 *)local_88.value_._M_len,local_88.value_._M_str,&local_a8);
    absl::lts_20250127::strings_internal::
    Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_40,&local_78);
    absl::lts_20250127::strings_internal::
    Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::~Splitter(&local_78);
    absl::lts_20250127::ByAnyChar::~ByAnyChar(&local_a8);
    for (virtual_path.field_2._8_8_ = 0;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_40), (ulong)virtual_path.field_2._8_8_ < sVar4;
        virtual_path.field_2._8_8_ = virtual_path.field_2._8_8_ + 1) {
      std::__cxx11::string::string((string *)(disk_path.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)&equals_pos);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_40,virtual_path.field_2._8_8_);
      local_120 = std::__cxx11::string::find_first_of((char)pvVar5,0x3d);
      if (local_120 == -1) {
        std::__cxx11::string::operator=((string *)(disk_path.field_2._M_local_buf + 8),"");
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_40,virtual_path.field_2._8_8_);
        std::__cxx11::string::operator=((string *)&equals_pos,(string *)pvVar5);
      }
      else {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_40,virtual_path.field_2._8_8_);
        std::__cxx11::string::substr((ulong)local_140,(ulong)pvVar5);
        std::__cxx11::string::operator=((string *)(disk_path.field_2._M_local_buf + 8),local_140);
        std::__cxx11::string::~string(local_140);
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_40,virtual_path.field_2._8_8_);
        std::__cxx11::string::substr((ulong)local_160,(ulong)pvVar5);
        std::__cxx11::string::operator=((string *)&equals_pos,local_160);
        std::__cxx11::string::~string(local_160);
      }
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        pcVar6 = (char *)std::__cxx11::string::c_str();
        iVar2 = access(pcVar6,0);
        if (iVar2 < 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_40,virtual_path.field_2._8_8_);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          iVar2 = access(pcVar6,0);
          if (iVar2 < 0) {
            poVar9 = std::operator<<((ostream *)&std::cerr,(string *)&equals_pos);
            poVar9 = std::operator<<(poVar9,": warning: directory does not exist.");
            std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          }
          else {
            std::__cxx11::string::operator=((string *)(disk_path.field_2._M_local_buf + 8),"");
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_40,virtual_path.field_2._8_8_);
            std::__cxx11::string::operator=((string *)&equals_pos,(string *)pvVar5);
          }
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&direct.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&disk_path.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&equals_pos)
        ;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back(&this->proto_path_,
                    (value_type *)
                    &direct.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&direct.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar1 = false;
      }
      else {
        poVar9 = std::operator<<((ostream *)&std::cerr,
                                 "--proto_path passed empty directory name.  (Use \".\" for current directory.)"
                                );
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        this_local._4_4_ = PARSE_ARGUMENT_FAIL;
        bVar1 = true;
      }
      std::__cxx11::string::~string((string *)&equals_pos);
      std::__cxx11::string::~string((string *)(disk_path.field_2._M_local_buf + 8));
      if (bVar1) goto LAB_002540da;
    }
    bVar1 = false;
LAB_002540da:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_40);
    if (!bVar1) {
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    return this_local._4_4_;
  }
  bVar1 = std::operator==(name,"--direct_dependencies");
  if (bVar1) {
    if ((this->direct_dependencies_explicitly_set_ & 1U) != 0) {
      poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
      poVar9 = std::operator<<(poVar9,
                               " may only be passed once. To specify multiple direct dependencies, pass them all as a single parameter separated by \':\'."
                              );
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      return PARSE_ARGUMENT_FAIL;
    }
    this->direct_dependencies_explicitly_set_ = true;
    absl::lts_20250127::strings_internal::ConvertibleToStringView::ConvertibleToStringView
              (&local_1e8,
               parts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    absl::lts_20250127::StrSplit<char,absl::lts_20250127::SkipEmpty>
              (&local_1d8,(lts_20250127 *)local_1e8.value_._M_len,local_1e8.value_._M_str,0x3a);
    absl::lts_20250127::strings_internal::
    Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1c0,&local_1d8);
    local_201 = 0;
    bVar1 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&(this->direct_dependencies_).
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   );
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                 ,0x84c,"direct_dependencies_.empty()");
      local_201 = 1;
      pLVar7 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_200);
      absl::lts_20250127::log_internal::Voidify::operator&&(local_1ea,pLVar7);
    }
    if ((local_201 & 1) == 0) {
      local_210._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1c0);
      local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1c0);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
      ::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                  *)&this->direct_dependencies_,local_210,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_218);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1c0);
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_200);
  }
  bVar1 = std::operator==(name,"--direct_dependencies_violation_msg");
  if (bVar1) {
    std::__cxx11::string::operator=
              ((string *)&this->direct_dependencies_violation_msg_,
               (string *)
               parts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return PARSE_ARGUMENT_DONE_AND_CONTINUE;
  }
  bVar1 = std::operator==(name,"--descriptor_set_in");
  if (bVar1) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->descriptor_set_in_names_);
    if (!bVar1) {
      poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
      poVar9 = std::operator<<(poVar9,
                               " may only be passed once. To specify multiple descriptor sets, pass them all as a single parameter separated by \'"
                              );
      poVar9 = std::operator<<(poVar9,":");
      poVar9 = std::operator<<(poVar9,"\'.");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      return PARSE_ARGUMENT_FAIL;
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        absl::lts_20250127::strings_internal::ConvertibleToStringView::ConvertibleToStringView
                  (&local_278,
                   parts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2a8,":");
        absl::lts_20250127::ByAnyChar::ByAnyChar(&local_298,local_2a8);
        absl::lts_20250127::StrSplit<absl::lts_20250127::ByAnyChar,absl::lts_20250127::SkipEmpty>
                  (&local_268,(lts_20250127 *)local_278.value_._M_len,local_278.value_._M_str,
                   &local_298);
        absl::lts_20250127::strings_internal::
        Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
        ::
        operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
                  (&local_230,&local_268);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&this->descriptor_set_in_names_,&local_230);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_230);
        absl::lts_20250127::strings_internal::
        Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
        ::~Splitter(&local_268);
        absl::lts_20250127::ByAnyChar::~ByAnyChar(&local_298);
        return PARSE_ARGUMENT_DONE_AND_CONTINUE;
      }
      poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
      poVar9 = std::operator<<(poVar9," cannot be used with --dependency_out.");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      return PARSE_ARGUMENT_FAIL;
    }
    poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
    poVar9 = std::operator<<(poVar9," requires a non-empty value.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    return PARSE_ARGUMENT_FAIL;
  }
  bVar1 = std::operator==(name,"-o");
  if ((bVar1) || (bVar1 = std::operator==(name,"--descriptor_set_out"), bVar1)) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
      poVar9 = std::operator<<(poVar9," may only be passed once.");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      return PARSE_ARGUMENT_FAIL;
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      if (this->mode_ == MODE_COMPILE) {
        std::__cxx11::string::operator=
                  ((string *)&this->descriptor_set_out_name_,
                   (string *)
                   parts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        return PARSE_ARGUMENT_DONE_AND_CONTINUE;
      }
      poVar9 = std::operator<<((ostream *)&std::cerr,
                               "Cannot use --encode or --decode and generate descriptors at the same time."
                              );
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      return PARSE_ARGUMENT_FAIL;
    }
    poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
    poVar9 = std::operator<<(poVar9," requires a non-empty value.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    return PARSE_ARGUMENT_FAIL;
  }
  bVar1 = std::operator==(name,"--dependency_out");
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
      poVar9 = std::operator<<(poVar9," may only be passed once.");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      return PARSE_ARGUMENT_FAIL;
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->descriptor_set_in_names_);
      if (bVar1) {
        std::__cxx11::string::operator=
                  ((string *)&this->dependency_out_name_,
                   (string *)
                   parts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        return PARSE_ARGUMENT_DONE_AND_CONTINUE;
      }
      poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
      poVar9 = std::operator<<(poVar9," cannot be used with --descriptor_set_in.");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      return PARSE_ARGUMENT_FAIL;
    }
    poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
    poVar9 = std::operator<<(poVar9," requires a non-empty value.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    return PARSE_ARGUMENT_FAIL;
  }
  bVar1 = std::operator==(name,"--include_imports");
  if (bVar1) {
    if ((this->imports_in_descriptor_set_ & 1U) == 0) {
      this->imports_in_descriptor_set_ = true;
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
    poVar9 = std::operator<<(poVar9," may only be passed once.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    return PARSE_ARGUMENT_FAIL;
  }
  bVar1 = std::operator==(name,"--include_source_info");
  if (bVar1) {
    if ((this->source_info_in_descriptor_set_ & 1U) == 0) {
      this->source_info_in_descriptor_set_ = true;
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
    poVar9 = std::operator<<(poVar9," may only be passed once.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    return PARSE_ARGUMENT_FAIL;
  }
  bVar1 = std::operator==(name,"--retain_options");
  if (bVar1) {
    if ((this->retain_options_in_descriptor_set_ & 1U) == 0) {
      this->retain_options_in_descriptor_set_ = true;
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
    poVar9 = std::operator<<(poVar9," may only be passed once.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    return PARSE_ARGUMENT_FAIL;
  }
  bVar1 = std::operator==(name,"-h");
  if ((bVar1) || (bVar1 = std::operator==(name,"--help"), bVar1)) {
    PrintHelpText(this);
    return PARSE_ARGUMENT_DONE_AND_EXIT;
  }
  bVar1 = std::operator==(name,"--version");
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      poVar9 = std::operator<<((ostream *)&std::cout,(string *)&this->version_info_);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
    poVar9 = std::operator<<((ostream *)&std::cout,"libprotoc ");
    internal::ProtocVersionString_abi_cxx11_
              ((string *)(plugin_name.field_2._M_local_buf + 8),(internal *)0x5c0698,version);
    poVar9 = std::operator<<(poVar9,(string *)(plugin_name.field_2._M_local_buf + 8));
    poVar9 = std::operator<<(poVar9,"-dev");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)(plugin_name.field_2._M_local_buf + 8));
    return PARSE_ARGUMENT_DONE_AND_EXIT;
  }
  bVar1 = std::operator==(name,"--disallow_services");
  if (bVar1) {
    this->disallow_services_ = true;
    return PARSE_ARGUMENT_DONE_AND_CONTINUE;
  }
  bVar1 = std::operator==(name,"--experimental_allow_proto3_optional");
  if (bVar1) {
    return PARSE_ARGUMENT_DONE_AND_CONTINUE;
  }
  bVar1 = std::operator==(name,"--encode");
  if (((bVar1) || (bVar1 = std::operator==(name,"--decode"), bVar1)) ||
     (bVar1 = std::operator==(name,"--decode_raw"), bVar1)) {
    if (this->mode_ != MODE_COMPILE) {
      poVar9 = std::operator<<((ostream *)&std::cerr,
                               "Only one of --encode and --decode can be specified.");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      return PARSE_ARGUMENT_FAIL;
    }
    bVar1 = std::
            vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
            ::empty(&this->output_directives_);
    if ((bVar1) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0)) {
      bVar1 = std::operator==(name,"--encode");
      MVar10 = MODE_DECODE;
      if (bVar1) {
        MVar10 = MODE_ENCODE;
      }
      this->mode_ = MVar10;
      uVar3 = std::__cxx11::string::empty();
      if (((uVar3 & 1) != 0) && (bVar1 = std::operator!=(name,"--decode_raw"), bVar1)) {
        poVar9 = std::operator<<((ostream *)&std::cerr,"Type name for ");
        poVar9 = std::operator<<(poVar9,(string *)name);
        poVar9 = std::operator<<(poVar9," cannot be blank.");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        bVar1 = std::operator==(name,"--decode");
        if (bVar1) {
          poVar9 = std::operator<<((ostream *)&std::cerr,
                                   "To decode an unknown message, use --decode_raw.");
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        }
        return PARSE_ARGUMENT_FAIL;
      }
      uVar3 = std::__cxx11::string::empty();
      if (((uVar3 & 1) == 0) && (bVar1 = std::operator==(name,"--decode_raw"), bVar1)) {
        poVar9 = std::operator<<((ostream *)&std::cerr,"--decode_raw does not take a parameter.");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        return PARSE_ARGUMENT_FAIL;
      }
      std::__cxx11::string::operator=
                ((string *)&this->codec_type_,
                 (string *)
                 parts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    poVar9 = std::operator<<((ostream *)&std::cerr,"Cannot use ");
    poVar9 = std::operator<<(poVar9,(string *)name);
    poVar9 = std::operator<<(poVar9," and generate code or descriptors at the same time.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    return PARSE_ARGUMENT_FAIL;
  }
  bVar1 = std::operator==(name,"--deterministic_output");
  if (bVar1) {
    this->deterministic_output_ = true;
    return PARSE_ARGUMENT_DONE_AND_CONTINUE;
  }
  bVar1 = std::operator==(name,"--error_format");
  if (bVar1) {
    bVar1 = std::operator==(parts.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,"gcc");
    if (bVar1) {
      this->error_format_ = ERROR_FORMAT_GCC;
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    bVar1 = std::operator==(parts.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,"msvs");
    if (bVar1) {
      this->error_format_ = ERROR_FORMAT_MSVS;
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    poVar9 = std::operator<<((ostream *)&std::cerr,"Unknown error format: ");
    poVar9 = std::operator<<(poVar9,(string *)
                                    parts.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    return PARSE_ARGUMENT_FAIL;
  }
  bVar1 = std::operator==(name,"--fatal_warnings");
  if (bVar1) {
    if ((this->fatal_warnings_ & 1U) == 0) {
      this->fatal_warnings_ = true;
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
    poVar9 = std::operator<<(poVar9," may only be passed once.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    return PARSE_ARGUMENT_FAIL;
  }
  bVar1 = std::operator==(name,"--plugin");
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::string((string *)(path.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)&equals_pos_1);
      slash_pos = std::__cxx11::string::find_first_of
                            ((char)parts.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,0x3d);
      if (slash_pos == 0xffffffffffffffff) {
        local_320 = std::__cxx11::string::find_last_of
                              ((char)parts.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,0x2f);
        if (local_320 == -1) {
          std::__cxx11::string::operator=
                    ((string *)(path.field_2._M_local_buf + 8),
                     (string *)
                     parts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          std::__cxx11::string::substr
                    ((ulong)local_340,
                     (ulong)parts.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::operator=((string *)(path.field_2._M_local_buf + 8),local_340);
          std::__cxx11::string::~string(local_340);
        }
        std::__cxx11::string::operator=
                  ((string *)&equals_pos_1,
                   (string *)
                   parts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        std::__cxx11::string::substr
                  ((ulong)local_360,
                   (ulong)parts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator=((string *)(path.field_2._M_local_buf + 8),local_360);
        std::__cxx11::string::~string(local_360);
        std::__cxx11::string::substr
                  ((ulong)local_380,
                   (ulong)parts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator=((string *)&equals_pos_1,local_380);
        std::__cxx11::string::~string(local_380);
      }
      pbVar8 = absl::lts_20250127::container_internal::
               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
               ::
               operator[]<std::__cxx11::string,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>>
                         ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                           *)&this->plugins_,
                          (key_arg<std::__cxx11::basic_string<char>_> *)((long)&path.field_2 + 8));
      std::__cxx11::string::operator=((string *)pbVar8,(string *)&equals_pos_1);
      std::__cxx11::string::~string((string *)&equals_pos_1);
      std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    poVar9 = std::operator<<((ostream *)&std::cerr,"This compiler does not support plugins.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    return PARSE_ARGUMENT_FAIL;
  }
  bVar1 = std::operator==(name,"--print_free_field_numbers");
  if (bVar1) {
    if (this->mode_ != MODE_COMPILE) {
      poVar9 = std::operator<<((ostream *)&std::cerr,"Cannot use ");
      poVar9 = std::operator<<(poVar9,(string *)name);
      poVar9 = std::operator<<(poVar9," and use --encode, --decode or print ");
      poVar9 = std::operator<<(poVar9,"other info at the same time.");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      return PARSE_ARGUMENT_FAIL;
    }
    bVar1 = std::
            vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
            ::empty(&this->output_directives_);
    if ((bVar1) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0)) {
      this->mode_ = MODE_PRINT;
      this->print_mode_ = PRINT_FREE_FIELDS;
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    poVar9 = std::operator<<((ostream *)&std::cerr,"Cannot use ");
    poVar9 = std::operator<<(poVar9,(string *)name);
    poVar9 = std::operator<<(poVar9," and generate code or descriptors at the same time.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    return PARSE_ARGUMENT_FAIL;
  }
  bVar1 = std::operator==(name,"--enable_codegen_trace");
  if (bVar1) {
    __name = std::basic_string_view<char,_std::char_traits<char>_>::data
                       (&io::Printer::kProtocCodegenTrace);
    setenv(__name,"yes",0);
    return PARSE_ARGUMENT_DONE_AND_CONTINUE;
  }
  bVar1 = std::operator==(name,"--notices");
  if (bVar1) {
    poVar9 = std::operator<<((ostream *)&std::cout,notices_text);
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    return PARSE_ARGUMENT_DONE_AND_EXIT;
  }
  bVar1 = std::operator==(name,"--experimental_editions");
  if (bVar1) {
    this->experimental_editions_ = true;
    return PARSE_ARGUMENT_DONE_AND_CONTINUE;
  }
  bVar1 = std::operator==(name,"--edition_defaults_out");
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
      poVar9 = std::operator<<(poVar9," may only be passed once.");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      return PARSE_ARGUMENT_FAIL;
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      if (this->mode_ == MODE_COMPILE) {
        std::__cxx11::string::operator=
                  ((string *)&this->edition_defaults_out_name_,
                   (string *)
                   parts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        return PARSE_ARGUMENT_DONE_AND_CONTINUE;
      }
      poVar9 = std::operator<<((ostream *)&std::cerr,
                               "Cannot use --encode or --decode and generate defaults at the same time."
                              );
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      return PARSE_ARGUMENT_FAIL;
    }
    poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
    poVar9 = std::operator<<(poVar9," requires a non-empty value.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    return PARSE_ARGUMENT_FAIL;
  }
  bVar1 = std::operator==(name,"--edition_defaults_minimum");
  if (bVar1) {
    if (this->edition_defaults_minimum_ != EDITION_UNKNOWN) {
      poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
      poVar9 = std::operator<<(poVar9," may only be passed once.");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      return PARSE_ARGUMENT_FAIL;
    }
    absl::lts_20250127::AlphaNum::AlphaNum(&local_3e0,"EDITION_");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_410,
               parts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_3b0,(lts_20250127 *)&local_3e0,&local_410,in_RCX);
    local_390 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_3b0);
    name_00._M_str = &this->edition_defaults_minimum_;
    name_00._M_len = local_390._8_8_;
    bVar1 = Edition_Parse(local_390._0_8_,name_00,(Edition *)local_390._0_8_);
    std::__cxx11::string::~string((string *)&local_3b0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
    poVar9 = std::operator<<(poVar9," unknown edition \"");
    poVar9 = std::operator<<(poVar9,(string *)
                                    parts.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar9 = std::operator<<(poVar9,"\".");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    return PARSE_ARGUMENT_FAIL;
  }
  bVar1 = std::operator==(name,"--edition_defaults_maximum");
  if (bVar1) {
    if (this->edition_defaults_maximum_ != EDITION_UNKNOWN) {
      poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
      poVar9 = std::operator<<(poVar9," may only be passed once.");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      return PARSE_ARGUMENT_FAIL;
    }
    absl::lts_20250127::AlphaNum::AlphaNum(&local_470,"EDITION_");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              ((AlphaNum *)&generator_info,
               parts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_440,(lts_20250127 *)&local_470,(AlphaNum *)&generator_info,in_RCX);
    local_420 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_440);
    name_01._M_str = &this->edition_defaults_maximum_;
    name_01._M_len = local_420._8_8_;
    bVar1 = Edition_Parse(local_420._0_8_,name_01,(Edition *)local_420._0_8_);
    std::__cxx11::string::~string((string *)&local_440);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return PARSE_ARGUMENT_DONE_AND_CONTINUE;
    }
    poVar9 = std::operator<<((ostream *)&std::cerr,(string *)name);
    poVar9 = std::operator<<(poVar9," unknown edition \"");
    poVar9 = std::operator<<(poVar9,(string *)
                                    parts.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar9 = std::operator<<(poVar9,"\".");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    return PARSE_ARGUMENT_FAIL;
  }
  local_4a8 = FindGeneratorByFlag(this,name);
  if (local_4a8 == (GeneratorInfo *)0x0) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
LAB_002556f6:
      local_4a8 = FindGeneratorByOption(this,name);
      if (local_4a8 != (GeneratorInfo *)0x0) {
        local_4d0 = absl::lts_20250127::container_internal::
                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    ::
                    operator[]<std::__cxx11::string,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>>
                              ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                *)&this->generator_parameters_,&local_4a8->flag_name);
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          std::__cxx11::string::append((char *)local_4d0);
        }
        std::__cxx11::string::append((string *)local_4d0);
        return PARSE_ARGUMENT_DONE_AND_CONTINUE;
      }
      local_4e0 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)name);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_4f0,"--");
      bVar1 = absl::lts_20250127::StartsWith(local_4e0,local_4f0);
      if (bVar1) {
        local_500 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)name);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&parameters_1,"_opt");
        bVar1 = absl::lts_20250127::EndsWith(local_500,_parameters_1);
        if (bVar1) {
          auVar11 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)&this->plugin_prefix_);
          plugin_prefix._M_len = auVar11._8_8_;
          auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)name);
          directive.output_location.field_2._8_8_ = auVar12._0_8_;
          plugin_prefix._M_str = (char *)directive.output_location.field_2._8_8_;
          directive_00._M_str = in_R9;
          directive_00._M_len = auVar12._8_8_;
          compiler::(anonymous_namespace)::PluginName_abi_cxx11_
                    (&local_538,auVar11._0_8_,plugin_prefix,directive_00);
          pbVar8 = absl::lts_20250127::container_internal::
                   raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::
                   operator[]<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nullptr>
                             (&(this->plugin_parameters_).
                               super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ,&local_538);
          std::__cxx11::string::~string((string *)&local_538);
          local_518 = pbVar8;
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) == 0) {
            std::__cxx11::string::append((char *)local_518);
          }
          std::__cxx11::string::append((string *)local_518);
          return PARSE_ARGUMENT_DONE_AND_CONTINUE;
        }
      }
      poVar9 = std::operator<<((ostream *)&std::cerr,"Unknown flag: ");
      poVar9 = std::operator<<(poVar9,(string *)name);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      return PARSE_ARGUMENT_FAIL;
    }
    local_4b8 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)name);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&parameters,"_out");
    bVar1 = absl::lts_20250127::EndsWith(local_4b8,_parameters);
    if (!bVar1) goto LAB_002556f6;
  }
  if (this->mode_ != MODE_COMPILE) {
    poVar9 = std::operator<<((ostream *)&std::cerr,
                             "Cannot use --encode, --decode or print .proto info and generate code at the same time."
                            );
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    return PARSE_ARGUMENT_FAIL;
  }
  OutputDirective::OutputDirective((OutputDirective *)&colon_pos);
  std::__cxx11::string::operator=((string *)&colon_pos,(string *)name);
  if (local_4a8 == (GeneratorInfo *)0x0) {
    directive.name.field_2._8_8_ = 0;
  }
  else {
    directive.name.field_2._8_8_ = local_4a8->generator;
  }
  local_5c8 = std::__cxx11::string::find_first_of
                        ((char)parts.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,0x3a);
  if (local_5c8 != -1) {
    bVar1 = anon_unknown_5::IsWindowsAbsolutePath
                      (parts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) {
      std::__cxx11::string::substr
                ((ulong)local_5e8,
                 (ulong)parts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::operator=((string *)&directive.generator,local_5e8);
      std::__cxx11::string::~string(local_5e8);
      std::__cxx11::string::substr
                ((ulong)local_608,
                 (ulong)parts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::operator=
                ((string *)(directive.parameter.field_2._M_local_buf + 8),local_608);
      std::__cxx11::string::~string(local_608);
      goto LAB_00255aec;
    }
  }
  std::__cxx11::string::operator=
            ((string *)(directive.parameter.field_2._M_local_buf + 8),
             (string *)
             parts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_00255aec:
  std::
  vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
  ::push_back(&this->output_directives_,(value_type *)&colon_pos);
  OutputDirective::~OutputDirective((OutputDirective *)&colon_pos);
  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}

Assistant:

CommandLineInterface::ParseArgumentStatus
CommandLineInterface::InterpretArgument(const std::string& name,
                                        const std::string& value) {
  if (name.empty()) {
    // Not a flag.  Just a filename.
    if (value.empty()) {
      std::cerr
          << "You seem to have passed an empty string as one of the "
             "arguments to "
          << executable_name_
          << ".  This is actually "
             "sort of hard to do.  Congrats.  Unfortunately it is not valid "
             "input so the program is going to die now."
          << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

#if defined(_WIN32)
    // On Windows, the shell (typically cmd.exe) does not expand wildcards in
    // file names (e.g. foo\*.proto), so we do it ourselves.
    switch (google::protobuf::io::win32::ExpandWildcards(
        value, [this](const std::string& path) {
          this->input_files_.push_back(path);
        })) {
      case google::protobuf::io::win32::ExpandWildcardsResult::kSuccess:
        break;
      case google::protobuf::io::win32::ExpandWildcardsResult::kErrorNoMatchingFile:
        // Path does not exist, is not a file, or it's longer than MAX_PATH and
        // long path handling is disabled.
        std::cerr << "Invalid file name pattern or missing input file \""
                  << value << "\"" << std::endl;
        return PARSE_ARGUMENT_FAIL;
      default:
        std::cerr << "Cannot convert path \"" << value
                  << "\" to or from Windows style" << std::endl;
        return PARSE_ARGUMENT_FAIL;
    }
#else   // not _WIN32
    // On other platforms than Windows (e.g. Linux, Mac OS) the shell (typically
    // Bash) expands wildcards.
    input_files_.push_back(value);
#endif  // _WIN32

  } else if (name == "-I" || name == "--proto_path") {
    // Java's -classpath (and some other languages) delimits path components
    // with colons.  Let's accept that syntax too just to make things more
    // intuitive.
    std::vector<std::string> parts = absl::StrSplit(
        value, absl::ByAnyChar(CommandLineInterface::kPathSeparator),
        absl::SkipEmpty());

    for (size_t i = 0; i < parts.size(); ++i) {
      std::string virtual_path;
      std::string disk_path;

      std::string::size_type equals_pos = parts[i].find_first_of('=');
      if (equals_pos == std::string::npos) {
        virtual_path = "";
        disk_path = parts[i];
      } else {
        virtual_path = parts[i].substr(0, equals_pos);
        disk_path = parts[i].substr(equals_pos + 1);
      }

      if (disk_path.empty()) {
        std::cerr
            << "--proto_path passed empty directory name.  (Use \".\" for "
               "current directory.)"
            << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }

      // Make sure disk path exists, warn otherwise.
      if (access(disk_path.c_str(), F_OK) < 0) {
        // Try the original path; it may have just happened to have a '=' in it.
        if (access(parts[i].c_str(), F_OK) < 0) {
          std::cerr << disk_path << ": warning: directory does not exist."
                    << std::endl;
        } else {
          virtual_path = "";
          disk_path = parts[i];
        }
      }

      // Don't use make_pair as the old/default standard library on Solaris
      // doesn't support it without explicit template parameters, which are
      // incompatible with C++0x's make_pair.
      proto_path_.push_back(
          std::pair<std::string, std::string>(virtual_path, disk_path));
    }

  } else if (name == "--direct_dependencies") {
    if (direct_dependencies_explicitly_set_) {
      std::cerr << name
                << " may only be passed once. To specify multiple "
                   "direct dependencies, pass them all as a single "
                   "parameter separated by ':'."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    direct_dependencies_explicitly_set_ = true;
    std::vector<std::string> direct =
        absl::StrSplit(value, ':', absl::SkipEmpty());
    ABSL_DCHECK(direct_dependencies_.empty());
    direct_dependencies_.insert(direct.begin(), direct.end());

  } else if (name == "--direct_dependencies_violation_msg") {
    direct_dependencies_violation_msg_ = value;

  } else if (name == "--descriptor_set_in") {
    if (!descriptor_set_in_names_.empty()) {
      std::cerr << name
                << " may only be passed once. To specify multiple "
                   "descriptor sets, pass them all as a single "
                   "parameter separated by '"
                << CommandLineInterface::kPathSeparator << "'." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!dependency_out_name_.empty()) {
      std::cerr << name << " cannot be used with --dependency_out."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    descriptor_set_in_names_ = absl::StrSplit(
        value, absl::ByAnyChar(CommandLineInterface::kPathSeparator),
        absl::SkipEmpty());

  } else if (name == "-o" || name == "--descriptor_set_out") {
    if (!descriptor_set_out_name_.empty()) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (mode_ != MODE_COMPILE) {
      std::cerr
          << "Cannot use --encode or --decode and generate descriptors at the "
             "same time."
          << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    descriptor_set_out_name_ = value;

  } else if (name == "--dependency_out") {
    if (!dependency_out_name_.empty()) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!descriptor_set_in_names_.empty()) {
      std::cerr << name << " cannot be used with --descriptor_set_in."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    dependency_out_name_ = value;

  } else if (name == "--include_imports") {
    if (imports_in_descriptor_set_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    imports_in_descriptor_set_ = true;

  } else if (name == "--include_source_info") {
    if (source_info_in_descriptor_set_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    source_info_in_descriptor_set_ = true;

  } else if (name == "--retain_options") {
    if (retain_options_in_descriptor_set_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    retain_options_in_descriptor_set_ = true;

  } else if (name == "-h" || name == "--help") {
    PrintHelpText();
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.

  } else if (name == "--version") {
    if (!version_info_.empty()) {
      std::cout << version_info_ << std::endl;
    }
    std::cout << "libprotoc "
              << ::google::protobuf::internal::ProtocVersionString(
                     PROTOBUF_VERSION)
              << PROTOBUF_VERSION_SUFFIX << std::endl;
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.

  } else if (name == "--disallow_services") {
    disallow_services_ = true;
  } else if (name == "--experimental_allow_proto3_optional") {
    // Flag is no longer observed, but we allow it for backward compat.
  } else if (name == "--encode" || name == "--decode" ||
             name == "--decode_raw") {
    if (mode_ != MODE_COMPILE) {
      std::cerr << "Only one of --encode and --decode can be specified."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!output_directives_.empty() || !descriptor_set_out_name_.empty()) {
      std::cerr << "Cannot use " << name
                << " and generate code or descriptors at the same time."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    mode_ = (name == "--encode") ? MODE_ENCODE : MODE_DECODE;

    if (value.empty() && name != "--decode_raw") {
      std::cerr << "Type name for " << name << " cannot be blank." << std::endl;
      if (name == "--decode") {
        std::cerr << "To decode an unknown message, use --decode_raw."
                  << std::endl;
      }
      return PARSE_ARGUMENT_FAIL;
    } else if (!value.empty() && name == "--decode_raw") {
      std::cerr << "--decode_raw does not take a parameter." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    codec_type_ = value;

  } else if (name == "--deterministic_output") {
    deterministic_output_ = true;

  } else if (name == "--error_format") {
    if (value == "gcc") {
      error_format_ = ERROR_FORMAT_GCC;
    } else if (value == "msvs") {
      error_format_ = ERROR_FORMAT_MSVS;
    } else {
      std::cerr << "Unknown error format: " << value << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

  } else if (name == "--fatal_warnings") {
    if (fatal_warnings_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    fatal_warnings_ = true;
  } else if (name == "--plugin") {
    if (plugin_prefix_.empty()) {
      std::cerr << "This compiler does not support plugins." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    std::string plugin_name;
    std::string path;

    std::string::size_type equals_pos = value.find_first_of('=');
    if (equals_pos == std::string::npos) {
      // Use the basename of the file.
      std::string::size_type slash_pos = value.find_last_of('/');
      if (slash_pos == std::string::npos) {
        plugin_name = value;
      } else {
        plugin_name = value.substr(slash_pos + 1);
      }
      path = value;
    } else {
      plugin_name = value.substr(0, equals_pos);
      path = value.substr(equals_pos + 1);
    }

    plugins_[plugin_name] = path;

  } else if (name == "--print_free_field_numbers") {
    if (mode_ != MODE_COMPILE) {
      std::cerr << "Cannot use " << name
                << " and use --encode, --decode or print "
                << "other info at the same time." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!output_directives_.empty() || !descriptor_set_out_name_.empty()) {
      std::cerr << "Cannot use " << name
                << " and generate code or descriptors at the same time."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    mode_ = MODE_PRINT;
    print_mode_ = PRINT_FREE_FIELDS;
  } else if (name == "--enable_codegen_trace") {
    // We use environment variables here so that subprocesses see this setting
    // when we spawn them.
    //
    // Setting environment variables is more-or-less asking for a data race,
    // because C got this wrong and did not mandate synchronization.
    // In practice, this code path is "only" in the main thread of protoc, and
    // it is common knowledge that touching setenv in a library is asking for
    // life-ruining bugs *anyways*. As such, there is a reasonable probability
    // that there isn't another thread kicking environment variables at this
    // moment.

#ifdef _WIN32
    ::_putenv(absl::StrCat(io::Printer::kProtocCodegenTrace, "=yes").c_str());
#else
    ::setenv(io::Printer::kProtocCodegenTrace.data(), "yes", 0);
#endif
  } else if (name == "--notices") {
    std::cout << notices_text << std::endl;
    return PARSE_ARGUMENT_DONE_AND_EXIT;
  } else if (name == "--experimental_editions") {
    // If you're reading this, you're probably wondering what
    // --experimental_editions is for and thinking of turning it on. This is an
    // experimental, undocumented, unsupported flag. Enable it at your own risk
    // (or, just don't!).
    experimental_editions_ = true;
  } else if (name == "--edition_defaults_out") {
    if (!edition_defaults_out_name_.empty()) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (mode_ != MODE_COMPILE) {
      std::cerr
          << "Cannot use --encode or --decode and generate defaults at the "
             "same time."
          << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    edition_defaults_out_name_ = value;
  } else if (name == "--edition_defaults_minimum") {
    if (edition_defaults_minimum_ != EDITION_UNKNOWN) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!Edition_Parse(absl::StrCat("EDITION_", value),
                       &edition_defaults_minimum_)) {
      std::cerr << name << " unknown edition \"" << value << "\"." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
  } else if (name == "--edition_defaults_maximum") {
    if (edition_defaults_maximum_ != EDITION_UNKNOWN) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!Edition_Parse(absl::StrCat("EDITION_", value),
                       &edition_defaults_maximum_)) {
      std::cerr << name << " unknown edition \"" << value << "\"." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
  } else {
    // Some other flag.  Look it up in the generators list.
    const GeneratorInfo* generator_info = FindGeneratorByFlag(name);
    if (generator_info == nullptr &&
        (plugin_prefix_.empty() || !absl::EndsWith(name, "_out"))) {
      // Check if it's a generator option flag.
      generator_info = FindGeneratorByOption(name);
      if (generator_info != nullptr) {
        std::string* parameters =
            &generator_parameters_[generator_info->flag_name];
        if (!parameters->empty()) {
          parameters->append(",");
        }
        parameters->append(value);
      } else if (absl::StartsWith(name, "--") && absl::EndsWith(name, "_opt")) {
        std::string* parameters =
            &plugin_parameters_[PluginName(plugin_prefix_, name)];
        if (!parameters->empty()) {
          parameters->append(",");
        }
        parameters->append(value);
      } else {
        std::cerr << "Unknown flag: " << name << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }
    } else {
      // It's an output flag.  Add it to the output directives.
      if (mode_ != MODE_COMPILE) {
        std::cerr << "Cannot use --encode, --decode or print .proto info and "
                     "generate code at the same time."
                  << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }

      OutputDirective directive;
      directive.name = name;
      if (generator_info == nullptr) {
        directive.generator = nullptr;
      } else {
        directive.generator = generator_info->generator;
      }

      // Split value at ':' to separate the generator parameter from the
      // filename.  However, avoid doing this if the colon is part of a valid
      // Windows-style absolute path.
      std::string::size_type colon_pos = value.find_first_of(':');
      if (colon_pos == std::string::npos || IsWindowsAbsolutePath(value)) {
        directive.output_location = value;
      } else {
        directive.parameter = value.substr(0, colon_pos);
        directive.output_location = value.substr(colon_pos + 1);
      }

      output_directives_.push_back(directive);
    }
  }

  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}